

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_get_rows::build_graph(test_get_rows *this,ggml_context *ctx)

{
  char cVar1;
  undefined8 uVar2;
  long lVar3;
  ggml_tensor *pgVar4;
  
  uVar2 = ggml_new_tensor_3d(ctx,this->type,(long)this->n,(long)this->m,(long)this->b);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar2,"in");
  lVar3 = ggml_new_tensor_2d(ctx,0x1a,(long)this->r,(long)this->b);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(lVar3,"rows");
  if (this->v == true) {
    lVar3 = ggml_view_2d(ctx,lVar3,(long)(this->r / 2),(long)this->b,*(undefined8 *)(lVar3 + 0x38),0
                        );
    ggml_set_name(lVar3,"view_of_rows");
  }
  cVar1 = ggml_is_matrix(uVar2);
  if (cVar1 != '\0') {
    cVar1 = ggml_is_vector(lVar3);
    if (cVar1 != '\0') {
      ggml_set_param(ctx,uVar2);
    }
  }
  pgVar4 = (ggml_tensor *)ggml_get_rows(ctx,uVar2,lVar3);
  ggml_set_name(pgVar4,"out");
  return pgVar4;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * in = ggml_new_tensor_3d(ctx, type, n, m, b);
        ggml_set_name(in, "in");

        ggml_tensor * rows = ggml_new_tensor_2d(ctx, GGML_TYPE_I32, r, b);
        ggml_set_name(rows, "rows");
        if (v) {
            rows = ggml_view_2d(ctx, rows, r/2, b, rows->nb[1], 0);
            ggml_set_name(rows, "view_of_rows");
        }

        const bool grad_supported = ggml_is_matrix(in) && ggml_is_vector(rows);
        if (grad_supported) {
            ggml_set_param(ctx, in);
            // rows is a constant input -> no gradients
        }

        ggml_tensor * out = ggml_get_rows(ctx, in, rows);
        ggml_set_name(out, "out");

        return out;
    }